

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.c
# Opt level: O0

_Bool container_internal_validate(container_t *container,uint8_t typecode,char **reason)

{
  long lVar1;
  uint32_t uVar2;
  char **in_RDX;
  char in_SIL;
  array_container_t *in_RDI;
  shared_container_t *shared_container;
  undefined4 in_stack_ffffffffffffffd0;
  array_container_t *in_stack_ffffffffffffffd8;
  char local_11;
  array_container_t *local_10;
  _Bool local_1;
  
  if (in_RDI == (array_container_t *)0x0) {
    *in_RDX = "container is NULL";
    return false;
  }
  local_11 = in_SIL;
  local_10 = in_RDI;
  if (in_SIL == '\x04') {
    uVar2 = croaring_refcount_get((croaring_refcount_t *)((long)&in_RDI->array + 4));
    if (uVar2 == 0) {
      *in_RDX = "shared container has zero refcount";
      return false;
    }
    if (*(char *)&in_RDI->array == '\x04') {
      *in_RDX = "shared container is nested";
      return false;
    }
    lVar1._0_4_ = in_RDI->cardinality;
    lVar1._4_4_ = in_RDI->capacity;
    if (lVar1 == 0) {
      *in_RDX = "shared container has NULL container";
      return false;
    }
    local_10 = *(array_container_t **)in_RDI;
    local_11 = *(char *)&in_RDI->array;
    in_stack_ffffffffffffffd8 = in_RDI;
  }
  if (local_11 == '\x01') {
    local_1 = bitset_container_validate
                        ((bitset_container_t *)in_stack_ffffffffffffffd8,
                         (char **)(ulong)CONCAT14(1,in_stack_ffffffffffffffd0));
  }
  else if (local_11 == '\x02') {
    local_1 = array_container_validate(local_10,in_RDX);
  }
  else if (local_11 == '\x03') {
    local_1 = run_container_validate((run_container_t *)local_10,in_RDX);
  }
  else {
    *in_RDX = "invalid typecode";
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool container_internal_validate(const container_t *container, uint8_t typecode,
                                 const char **reason) {
    if (container == NULL) {
        *reason = "container is NULL";
        return false;
    }
    // Not using container_unwrap_shared because it asserts if shared containers
    // are nested
    if (typecode == SHARED_CONTAINER_TYPE) {
        const shared_container_t *shared_container =
            const_CAST_shared(container);
        if (croaring_refcount_get(&shared_container->counter) == 0) {
            *reason = "shared container has zero refcount";
            return false;
        }
        if (shared_container->typecode == SHARED_CONTAINER_TYPE) {
            *reason = "shared container is nested";
            return false;
        }
        if (shared_container->container == NULL) {
            *reason = "shared container has NULL container";
            return false;
        }
        container = shared_container->container;
        typecode = shared_container->typecode;
    }
    switch (typecode) {
        case BITSET_CONTAINER_TYPE:
            return bitset_container_validate(const_CAST_bitset(container),
                                             reason);
        case ARRAY_CONTAINER_TYPE:
            return array_container_validate(const_CAST_array(container),
                                            reason);
        case RUN_CONTAINER_TYPE:
            return run_container_validate(const_CAST_run(container), reason);
        default:
            *reason = "invalid typecode";
            return false;
    }
}